

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<long>::test_small_numerators<(libdivide::Branching)0>
          (DivideTest<long> *this,long denom,divider<long,_(libdivide::Branching)0> *the_divider)

{
  int32_t i;
  int32_t small_stop;
  divider<long,_(libdivide::Branching)0> *in_stack_00000038;
  long in_stack_00000040;
  long in_stack_00000048;
  DivideTest<long> *in_stack_00000050;
  undefined4 local_20;
  
  for (local_20 = 0; local_20 < 0x4000; local_20 = local_20 + 1) {
    test_one<(libdivide::Branching)0>
              (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
    test_one<(libdivide::Branching)0>
              (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
  }
  return;
}

Assistant:

void test_small_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test small numerators < 2^16
        // balance signed & unsigned testing
#if defined(__AVR__)
        int32_t small_stop = (limits::is_signed) ? (int32_t)1 << 7 : (uint32_t)1 << 8;
#else
        int32_t small_stop = (limits::is_signed) ? (int32_t)1 << 14 : (uint32_t)1 << 16;
#endif
        for (int32_t i = 0; i < small_stop; ++i) {
            test_one((T)i, denom, the_divider);

            if (limits::is_signed) {
                test_one((T)-i, denom, the_divider);
            }
        }
    }